

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

ON_SubD_ComponentIdTypeAndTag
ON_SubD_ComponentIdTypeAndTag::FindFromTypeAndId
          (Type type,uint id,ON_SimpleArray<ON_SubD_ComponentIdTypeAndTag> *sorted_tags)

{
  ON_SubD_ComponentIdTypeAndTag OVar1;
  int i_00;
  ON_SubD_ComponentIdTypeAndTag *local_48;
  undefined1 local_38 [4];
  int i;
  ON_SubD_ComponentIdTypeAndTag itt;
  ON_SimpleArray<ON_SubD_ComponentIdTypeAndTag> *sorted_tags_local;
  uint id_local;
  float fStack_14;
  Type type_local;
  undefined8 local_10;
  
  if ((id == 0) || (type == Unset)) {
    id_local = 0;
    fStack_14 = 0.0;
    local_10._0_4_ = 0;
    local_10._4_1_ = Unset;
    local_10._5_1_ = '\0';
    local_10._6_2_ = 0;
  }
  else {
    itt._8_8_ = sorted_tags;
    ON_SubD_ComponentIdTypeAndTag((ON_SubD_ComponentIdTypeAndTag *)local_38);
    itt.m_sharpness.m_edge_sharpness[0] = (float)id;
    itt.m_sharpness.m_edge_sharpness[1]._0_1_ = type;
    i_00 = ON_SimpleArray<ON_SubD_ComponentIdTypeAndTag>::BinarySearch
                     ((ON_SimpleArray<ON_SubD_ComponentIdTypeAndTag> *)itt._8_8_,
                      (ON_SubD_ComponentIdTypeAndTag *)local_38,CompareTypeAndId);
    if (i_00 < 0) {
      local_48 = &Unset;
    }
    else {
      local_48 = ON_SimpleArray<ON_SubD_ComponentIdTypeAndTag>::operator[]
                           ((ON_SimpleArray<ON_SubD_ComponentIdTypeAndTag> *)itt._8_8_,i_00);
    }
    _id_local = *&(local_48->m_sharpness).m_edge_sharpness;
    local_10._0_4_ = local_48->m_id;
    local_10._4_1_ = local_48->m_type;
    local_10._5_1_ = local_48->m_tag_and_dirx;
    local_10._6_2_ = local_48->m_reserved;
  }
  OVar1.m_id = (uint)local_10;
  OVar1.m_type = local_10._4_1_;
  OVar1.m_tag_and_dirx = local_10._5_1_;
  OVar1.m_reserved = local_10._6_2_;
  OVar1.m_sharpness.m_edge_sharpness[0] = (float)id_local;
  OVar1.m_sharpness.m_edge_sharpness[1] = fStack_14;
  return OVar1;
}

Assistant:

const ON_SubD_ComponentIdTypeAndTag ON_SubD_ComponentIdTypeAndTag::FindFromTypeAndId(ON_SubDComponentPtr::Type type, unsigned id, const ON_SimpleArray< ON_SubD_ComponentIdTypeAndTag>& sorted_tags)
{
  if (0 == id || ON_SubDComponentPtr::Type::Unset == type)
    return ON_SubD_ComponentIdTypeAndTag::Unset;
  ON_SubD_ComponentIdTypeAndTag itt;
  itt.m_id = id;
  itt.m_type = type;
  const int i = sorted_tags.BinarySearch(&itt, ON_SubD_ComponentIdTypeAndTag::CompareTypeAndId);
  return (i >= 0) ? sorted_tags[i] : ON_SubD_ComponentIdTypeAndTag::Unset;
}